

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O2

bool __thiscall duckdb::RowGroupCollection::IsEmpty(RowGroupCollection *this)

{
  bool bVar1;
  RowGroupSegmentTree *pRVar2;
  SegmentLock l;
  unique_lock<std::mutex> local_20;
  
  pRVar2 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  ::std::unique_lock<std::mutex>::unique_lock
            (&local_20,&(pRVar2->super_SegmentTree<duckdb::RowGroup,_true>).node_lock);
  bVar1 = IsEmpty(this,(SegmentLock *)&local_20);
  ::std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return bVar1;
}

Assistant:

bool RowGroupCollection::IsEmpty() const {
	auto l = row_groups->Lock();
	return IsEmpty(l);
}